

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Vec_Int_t * Dtc_ManFindCommonCuts(Gia_Man_t *p,Vec_Int_t *vCutsXor,Vec_Int_t *vCutsMaj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  
  piVar7 = vCutsXor->pArray;
  piVar8 = vCutsMaj->pArray;
  iVar2 = vCutsXor->nSize;
  iVar3 = vCutsMaj->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  if (((long)iVar2 & 3U) != 0) {
    __assert_fail("Vec_IntSize(vCutsXor) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x178,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (((long)iVar3 & 3U) != 0) {
    __assert_fail("Vec_IntSize(vCutsMaj) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x179,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (0 < iVar3 && 0 < iVar2) {
    piVar4 = piVar7 + iVar2;
    piVar1 = piVar8 + iVar3;
    do {
      uVar5 = 0;
      do {
        if (piVar7[uVar5] != piVar8[uVar5]) goto LAB_0066fc77;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 3);
      uVar5 = 3;
LAB_0066fc77:
      if ((int)uVar5 == 3) {
        lVar6 = 0;
        do {
          Vec_IntPush(p_00,piVar7[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        Vec_IntPush(p_00,piVar8[3]);
        piVar7 = piVar7 + 4;
        piVar8 = piVar8 + 4;
      }
      else if (piVar7[uVar5 & 0xffffffff] < piVar8[uVar5 & 0xffffffff]) {
        piVar7 = piVar7 + 4;
      }
      else {
        piVar8 = piVar8 + (ulong)(piVar8[uVar5 & 0xffffffff] < piVar7[uVar5 & 0xffffffff]) * 4;
      }
    } while ((piVar7 < piVar4) && (piVar8 < piVar1));
  }
  if (p_00->nSize * -0x33333333 + 0x19999999U < 0x33333333) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                ,0x18c,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Dtc_ManFindCommonCuts( Gia_Man_t * p, Vec_Int_t * vCutsXor, Vec_Int_t * vCutsMaj )
{
    int * pCuts0 = Vec_IntArray(vCutsXor);
    int * pCuts1 = Vec_IntArray(vCutsMaj);
    int * pLimit0 = Vec_IntLimit(vCutsXor);
    int * pLimit1 = Vec_IntLimit(vCutsMaj);   int i;
    Vec_Int_t * vFadds = Vec_IntAlloc( 1000 );
    assert( Vec_IntSize(vCutsXor) % 4 == 0 );
    assert( Vec_IntSize(vCutsMaj) % 4 == 0 );
    while ( pCuts0 < pLimit0 && pCuts1 < pLimit1 )
    {
        for ( i = 0; i < 3; i++ )
            if ( pCuts0[i] != pCuts1[i] )
                break;
        if ( i == 3 )
        {
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vFadds, pCuts0[i] );
            Vec_IntPush( vFadds, pCuts1[3] );
            pCuts0 += 4;
            pCuts1 += 4;
        }
        else if ( pCuts0[i] < pCuts1[i] )
            pCuts0 += 4;
        else if ( pCuts0[i] > pCuts1[i] )
            pCuts1 += 4;
    }
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    return vFadds;
}